

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall
cfd::core::DescriptorKeyInfo::DescriptorKeyInfo
          (DescriptorKeyInfo *this,string *key,string *parent_key_information)

{
  bool bVar1;
  undefined1 uVar2;
  ulong uVar3;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  reference pvVar6;
  undefined7 in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc0f;
  ExtPrivkey *in_stack_fffffffffffffc10;
  string *in_stack_fffffffffffffc20;
  CfdError in_stack_fffffffffffffc2c;
  CfdException *in_stack_fffffffffffffc30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *str;
  string local_330;
  Privkey local_310;
  string errmsg_1;
  CfdException *except_1;
  undefined1 local_2a0 [8];
  Privkey privkey;
  string errmsg;
  CfdException *except;
  undefined1 local_230 [8];
  SchnorrPubkey schnorr;
  Pubkey local_200;
  undefined1 local_1e8 [8];
  ByteData bytes;
  undefined1 local_1c8 [7];
  bool is_wif;
  ExtPrivkey local_158;
  string local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  size_t index;
  string local_b0 [32];
  undefined1 local_90 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string hdkey_top;
  string local_50 [48];
  string *local_20;
  string *parent_key_information_local;
  string *key_local;
  DescriptorKeyInfo *this_local;
  
  local_20 = parent_key_information;
  parent_key_information_local = key;
  key_local = (string *)this;
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  Pubkey::Pubkey(&this->pubkey_);
  Privkey::Privkey(&this->privkey_);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  ::std::__cxx11::string::string((string *)&this->parent_info_);
  ::std::__cxx11::string::string((string *)&this->path_);
  ::std::__cxx11::string::string((string *)&this->key_string_);
  uVar3 = ::std::__cxx11::string::size();
  if (3 < uVar3) {
    ::std::__cxx11::string::substr
              ((ulong)&list.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (ulong)parent_key_information_local);
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffc10,
                              (char *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08))
    ;
    if ((bVar1) ||
       (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffc10,
                                  (char *)CONCAT17(in_stack_fffffffffffffc0f,
                                                   in_stack_fffffffffffffc08)), bVar1)) {
      str = parent_key_information_local;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b0,"/",(allocator *)((long)&index + 7));
      StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_90,(string *)str,(string *)local_b0);
      ::std::__cxx11::string::~string(local_b0);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&index + 7));
      local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      while (__rhs = local_c0,
            pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ::std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_90), __rhs < pbVar5) {
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_90,(size_type)local_c0);
        ::std::operator+((char *)str,__rhs);
        ::std::__cxx11::string::operator+=((string *)&this->path_,local_e0);
        ::std::__cxx11::string::~string(local_e0);
        local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_c0->field_0x1;
      }
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffc10,
                                (char *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08
                                                ));
      if (bVar1) {
        this->key_type_ = kDescriptorKeyBip32Priv;
        pvVar6 = ::std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_90,0);
        ExtPrivkey::ExtPrivkey(&local_158,pvVar6);
        ExtPrivkey::operator=(&this->extprivkey_,&local_158);
        ExtPrivkey::~ExtPrivkey(in_stack_fffffffffffffc10);
      }
      else {
        this->key_type_ = kDescriptorKeyBip32;
        pvVar6 = ::std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_90,0);
        ExtPubkey::ExtPubkey((ExtPubkey *)local_1c8,pvVar6);
        ExtPubkey::operator=(&this->extpubkey_,(ExtPubkey *)local_1c8);
        ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffffc10);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffc20);
    }
    else {
      this->key_type_ = kDescriptorKeyPublic;
      bytes.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      ByteData::ByteData((ByteData *)local_1e8,parent_key_information_local);
      bVar1 = Pubkey::IsValid((ByteData *)local_1e8);
      if (bVar1) {
        ByteData::ByteData(&in_stack_fffffffffffffc10->serialize_data_,
                           (ByteData *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08)
                          );
        Pubkey::Pubkey(&local_200,
                       (ByteData *)
                       &schnorr.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
        Pubkey::operator=(&this->pubkey_,&local_200);
        Pubkey::~Pubkey((Pubkey *)0x40ab30);
        ByteData::~ByteData((ByteData *)0x40ab3c);
      }
      else {
        SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_230,(ByteData *)local_1e8);
        SchnorrPubkey::operator=(&this->schnorr_pubkey_,(SchnorrPubkey *)local_230);
        SchnorrPubkey::GetHex_abi_cxx11_((string *)&except,&this->schnorr_pubkey_);
        ::std::__cxx11::string::operator=((string *)&this->key_string_,(string *)&except);
        ::std::__cxx11::string::~string((string *)&except);
        this->key_type_ = kDescriptorKeySchnorr;
        SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x40ac06);
      }
      ByteData::~ByteData((ByteData *)0x40ac2e);
      if ((bytes.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        Privkey::Privkey((Privkey *)local_2a0);
        Privkey::FromWif((Privkey *)&except_1,parent_key_information_local,kMainnet,true);
        Privkey::operator=((Privkey *)in_stack_fffffffffffffc10,
                           (Privkey *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08))
        ;
        Privkey::~Privkey((Privkey *)0x40add9);
        uVar2 = Privkey::IsValid(&this->privkey_);
        if (!(bool)uVar2) {
          Privkey::FromWif(&local_310,parent_key_information_local,kTestnet,true);
          Privkey::operator=((Privkey *)in_stack_fffffffffffffc10,
                             (Privkey *)CONCAT17(uVar2,in_stack_fffffffffffffc08));
          Privkey::~Privkey((Privkey *)0x40af96);
        }
        Privkey::GetWif_abi_cxx11_(&local_330,&this->privkey_);
        ::std::__cxx11::string::operator=((string *)&this->key_string_,(string *)&local_330);
        ::std::__cxx11::string::~string((string *)&local_330);
        Privkey::~Privkey((Privkey *)0x40b008);
      }
    }
    uVar3 = ::std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      ::std::__cxx11::string::operator=
                ((string *)&this->parent_info_,(string *)parent_key_information);
    }
    ::std::__cxx11::string::~string
              ((string *)
               &list.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return;
  }
  hdkey_top.field_2._M_local_buf[0xe] = '\x01';
  uVar4 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_50,"DescriptorKeyInfo illegal key.",
             (allocator *)(hdkey_top.field_2._M_local_buf + 0xf));
  CfdException::CfdException
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,in_stack_fffffffffffffc20);
  hdkey_top.field_2._M_local_buf[0xe] = '\0';
  __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

DescriptorKeyInfo::DescriptorKeyInfo(
    const std::string& key, const std::string parent_key_information) {
  if (key.size() < 4) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "DescriptorKeyInfo illegal key.");
  }
  // analyze format
  std::string hdkey_top = key.substr(1, 3);
  if ((hdkey_top == "pub") || (hdkey_top == "prv")) {
    std::vector<std::string> list = StringUtil::Split(key, "/");
    for (size_t index = 1; index < list.size(); ++index) {
      path_ += "/" + list[index];
    }
    if (hdkey_top == "prv") {
      key_type_ = DescriptorKeyType::kDescriptorKeyBip32Priv;
      extprivkey_ = ExtPrivkey(list[0]);
    } else {
      key_type_ = DescriptorKeyType::kDescriptorKeyBip32;
      extpubkey_ = ExtPubkey(list[0]);
    }
  } else {
    key_type_ = DescriptorKeyType::kDescriptorKeyPublic;
    bool is_wif = false;
    try {
      // pubkey format check
      ByteData bytes(key);
      if (Pubkey::IsValid(bytes)) {
        // pubkey
        pubkey_ = Pubkey(bytes);
      } else {
        // schnorr pubkey
        SchnorrPubkey schnorr(bytes);
        schnorr_pubkey_ = schnorr;
        key_string_ = schnorr_pubkey_.GetHex();
        key_type_ = DescriptorKeyType::kDescriptorKeySchnorr;
      }
    } catch (const CfdException& except) {
      std::string errmsg(except.what());
      if (Privkey::HasWif(key)) {
        is_wif = true;
      } else {
        throw except;
      }
    }
    if (is_wif) {
      Privkey privkey;
      // privkey WIF check
      try {
        privkey_ = Privkey::FromWif(key, NetType::kMainnet);
      } catch (const CfdException& except) {
        std::string errmsg(except.what());
        if (errmsg.find("Error WIF to Private key.") == std::string::npos) {
          throw except;
        }
      }
      if (!privkey_.IsValid()) {
        privkey_ = Privkey::FromWif(key, NetType::kTestnet);
      }
      key_string_ = privkey_.GetWif();
    }
  }

  if (!parent_key_information.empty()) {
    parent_info_ = parent_key_information;
  }
}